

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O1

int lheader(lua_State *L)

{
  int iVar1;
  size_t in_RAX;
  char *pcVar2;
  size_t sVar3;
  ulong n;
  size_t len;
  size_t local_18;
  
  local_18 = in_RAX;
  pcVar2 = luaL_checklstring(L,1,&local_18);
  if (local_18 - 5 < 0xfffffffffffffffc) {
    iVar1 = luaL_error(L,"Invalid read %s",pcVar2);
  }
  else {
    if ((int)local_18 < 1) {
      n = 0;
    }
    else {
      sVar3 = 0;
      n = 0;
      do {
        n = n << 8 | (ulong)(byte)pcVar2[sVar3];
        sVar3 = sVar3 + 1;
      } while (local_18 != sVar3);
    }
    lua_pushinteger(L,n);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int
lheader(lua_State *L) {
	size_t len;
	const uint8_t * s = (const uint8_t *)luaL_checklstring(L, 1, &len);
	if (len > 4 || len < 1) {
		return luaL_error(L, "Invalid read %s", s);
	}
	int i;
	size_t sz = 0;
	for (i=0;i<(int)len;i++) {
		sz <<= 8;
		sz |= s[i];
	}

	lua_pushinteger(L, (lua_Integer)sz);

	return 1;
}